

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall spectest::JSONParser::ParseFilename(JSONParser *this,string *out_filename)

{
  Result RVar1;
  Enum EVar2;
  string_view filename;
  string local_38;
  
  RVar1 = ParseKeyStringValue(this,"filename",out_filename);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    filename._M_str = (out_filename->_M_dataplus)._M_p;
    filename._M_len = out_filename->_M_string_length;
    CreateModulePath_abi_cxx11_(&local_38,this,filename);
    std::__cxx11::string::operator=((string *)out_filename,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

wabt::Result JSONParser::ParseFilename(std::string* out_filename) {
  PARSE_KEY_STRING_VALUE("filename", out_filename);
  *out_filename = CreateModulePath(*out_filename);
  return wabt::Result::Ok;
}